

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void base_unmap(tsdn_t *tsdn,extent_hooks_t *extent_hooks,uint ind,void *addr,size_t size)

{
  _Bool _Var1;
  char cVar2;
  arena_t *arena;
  char *in_FS_OFFSET;
  
  if (extent_hooks == &extent_hooks_default) {
    _Var1 = extent_dalloc_mmap(addr,size);
    if (_Var1) {
      _Var1 = pages_decommit(addr,size);
      if (_Var1) {
        _Var1 = pages_purge_forced(addr,size);
        if (_Var1) {
          pages_purge_lazy(addr,size);
        }
      }
    }
    goto LAB_00114147;
  }
  arena = (arena_t *)extent_hooks;
  if ((tsdn == (tsdn_t *)0x0) && (tsdn = *(tsdn_t **)in_FS_OFFSET, *in_FS_OFFSET != '\0')) {
    arena = (arena_t *)0x0;
    tsdn = (tsdn_t *)tsd_fetch_slow(&tsdn->tsd,false);
  }
  pre_reentrancy(&tsdn->tsd,arena);
  if (extent_hooks->dalloc == (extent_dalloc_t *)0x0) {
LAB_001140a6:
    if ((code *)extent_hooks->decommit != (code *)0x0) {
      cVar2 = (*(code *)extent_hooks->decommit)(extent_hooks,addr,size,0,size,ind);
      if (cVar2 == '\0') goto LAB_00114105;
    }
    if ((code *)extent_hooks->purge_forced != (code *)0x0) {
      cVar2 = (*(code *)extent_hooks->purge_forced)(extent_hooks,addr,size,0,size,ind);
      if (cVar2 == '\0') goto LAB_00114105;
    }
    if ((code *)extent_hooks->purge_lazy != (code *)0x0) {
      (*(code *)extent_hooks->purge_lazy)(extent_hooks,addr,size,0,size,ind);
    }
  }
  else {
    _Var1 = (*extent_hooks->dalloc)(extent_hooks,addr,size,true,ind);
    if (_Var1) goto LAB_001140a6;
  }
LAB_00114105:
  post_reentrancy(&tsdn->tsd);
LAB_00114147:
  if ((opt_metadata_thp != metadata_thp_disabled) && (init_system_thp_mode == thp_mode_default)) {
    pages_nohuge(addr,size);
    return;
  }
  return;
}

Assistant:

static void
base_unmap(tsdn_t *tsdn, extent_hooks_t *extent_hooks, unsigned ind, void *addr,
    size_t size) {
	/*
	 * Cascade through dalloc, decommit, purge_forced, and purge_lazy,
	 * stopping at first success.  This cascade is performed for consistency
	 * with the cascade in extent_dalloc_wrapper() because an application's
	 * custom hooks may not support e.g. dalloc.  This function is only ever
	 * called as a side effect of arena destruction, so although it might
	 * seem pointless to do anything besides dalloc here, the application
	 * may in fact want the end state of all associated virtual memory to be
	 * in some consistent-but-allocated state.
	 */
	if (extent_hooks == &extent_hooks_default) {
		if (!extent_dalloc_mmap(addr, size)) {
			goto label_done;
		}
		if (!pages_decommit(addr, size)) {
			goto label_done;
		}
		if (!pages_purge_forced(addr, size)) {
			goto label_done;
		}
		if (!pages_purge_lazy(addr, size)) {
			goto label_done;
		}
		/* Nothing worked.  This should never happen. */
		not_reached();
	} else {
		tsd_t *tsd = tsdn_null(tsdn) ? tsd_fetch() : tsdn_tsd(tsdn);
		pre_reentrancy(tsd, NULL);
		if (extent_hooks->dalloc != NULL &&
		    !extent_hooks->dalloc(extent_hooks, addr, size, true,
		    ind)) {
			goto label_post_reentrancy;
		}
		if (extent_hooks->decommit != NULL &&
		    !extent_hooks->decommit(extent_hooks, addr, size, 0, size,
		    ind)) {
			goto label_post_reentrancy;
		}
		if (extent_hooks->purge_forced != NULL &&
		    !extent_hooks->purge_forced(extent_hooks, addr, size, 0,
		    size, ind)) {
			goto label_post_reentrancy;
		}
		if (extent_hooks->purge_lazy != NULL &&
		    !extent_hooks->purge_lazy(extent_hooks, addr, size, 0, size,
		    ind)) {
			goto label_post_reentrancy;
		}
		/* Nothing worked.  That's the application's problem. */
	label_post_reentrancy:
		post_reentrancy(tsd);
	}
label_done:
	if (metadata_thp_madvise()) {
		/* Set NOHUGEPAGE after unmap to avoid kernel defrag. */
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (size & HUGEPAGE_MASK) == 0);
		pages_nohuge(addr, size);
	}
}